

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptNativeIntArray::SetItem
          (JavascriptNativeIntArray *this,uint32 index,Var value,PropertyOperationFlags flags)

{
  TypeId TVar1;
  double dStack_30;
  TypeId typeId;
  double dValue;
  int32 iValue;
  PropertyOperationFlags flags_local;
  Var value_local;
  JavascriptNativeIntArray *pJStack_10;
  uint32 index_local;
  JavascriptNativeIntArray *this_local;
  
  dValue._4_4_ = flags;
  _iValue = value;
  value_local._4_4_ = index;
  pJStack_10 = this;
  JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(this);
  TVar1 = TrySetNativeIntArrayItem(this,_iValue,(int32 *)&dValue,&stack0xffffffffffffffd0);
  if (TVar1 == TypeIds_NativeIntArray) {
    SetItem(this,value_local._4_4_,dValue._0_4_);
  }
  else if (TVar1 == TypeIds_ArrayLast) {
    Js::JavascriptArray::DirectSetItemAt<double>
              ((JavascriptArray *)this,value_local._4_4_,dStack_30);
  }
  else {
    Js::JavascriptArray::DirectSetItemAt<void*>((JavascriptArray *)this,value_local._4_4_,_iValue);
  }
  return 1;
}

Assistant:

BOOL JavascriptNativeIntArray::SetItem(uint32 index, Var value, PropertyOperationFlags flags)
    {
        int32 iValue;
        double dValue;
#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(this);
#endif
        TypeId typeId = this->TrySetNativeIntArrayItem(value, &iValue, &dValue);
        if (typeId == TypeIds_NativeIntArray)
        {
            this->SetItem(index, iValue);
        }
        else if (typeId == TypeIds_NativeFloatArray)
        {
            reinterpret_cast<JavascriptNativeFloatArray*>(this)->DirectSetItemAt<double>(index, dValue);
        }
        else
        {
            this->DirectSetItemAt<Var>(index, value);
        }

        return TRUE;
    }